

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O3

int __thiscall MlmWrap::processMlmReplyMsg(MlmWrap *this,TrodesMsg *msg)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  iterator __position;
  string type;
  long *local_70 [2];
  long local_60 [2];
  string local_50;
  
  TrodesMsg::popstr_abi_cxx11_(&local_50,msg);
  __position = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::find(&(this->trackers)._M_t,&local_50);
  p_Var1 = &(this->trackers)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)__position._M_node != p_Var1) {
    zloop_timer_end(this->reactor,__position._M_node[2]._M_color);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
    ::erase_abi_cxx11_((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                        *)&this->trackers,__position);
  }
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_70,local_50._M_dataplus._M_p,
             local_50._M_dataplus._M_p + local_50._M_string_length);
  iVar2 = (*this->_vptr_MlmWrap[5])(this,local_70,msg);
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  if ((_Rb_tree_header *)__position._M_node != p_Var1) {
    zstr_send(this->usrpipe,"BURs");
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return iVar2;
}

Assistant:

int MlmWrap::processMlmReplyMsg(TrodesMsg &msg) {
    int rc = 0;
    std::string type = msg.popstr();
    auto search = trackers.find(type);
    bool tracker = false;
    //There is a timer still out for this reply. Cancel it, remove it from map, reply success to unblock.
    if(search != trackers.end()){
        zloop_timer_end(reactor, search->second);
        trackers.erase(search);
        tracker = true;
    }

    rc = processReplyMsg(type, msg);
    if(tracker){
        zstr_send(usrpipe, blockrepsuccess);
    }
    return(rc);
}